

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CircularBuffer.h
# Opt level: O0

size_t __thiscall
axl::sl::CircularBufferBase<char>::writeFront(CircularBufferBase<char> *this,char *p,size_t length)

{
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  ulong in_RDX;
  char *in_RSI;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *in_RDI;
  CircularBufferBase<char> *unaff_retaddr;
  size_t leftover;
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> *i;
  
  i = in_RDI;
  sVar2 = ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(in_RDI);
  uVar3 = sVar2 - in_RDI[1].m_count;
  if (uVar3 < in_RDX) {
    in_RDX = uVar3;
  }
  pcVar1 = in_RDI[1].m_p;
  uVar3 = in_RDX;
  sVar2 = ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(in_RDI);
  sVar4 = ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(in_RDI);
  in_RDI[1].m_p = (char *)((ulong)(pcVar1 + (sVar2 - in_RDX)) % sVar4);
  copyTo(unaff_retaddr,(size_t)i,in_RSI,uVar3);
  in_RDI[1].m_count = uVar3 + in_RDI[1].m_count;
  return uVar3;
}

Assistant:

size_t
	writeFront(
		const C* p,
		size_t length
	) {
		size_t leftover = m_buffer.getCount() - m_length;
		if (length > leftover)
			length = leftover;

		m_front = (m_front - length + m_buffer.getCount()) % m_buffer.getCount();
		copyTo(m_front, p, length);
		m_length += length;

		ASSERT(isValid());
		return length;
	}